

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

void __thiscall
testing::internal::FunctionMockerBase<int_(int)>::~FunctionMockerBase
          (FunctionMockerBase<int_(int)> *this)

{
  GTestMutexLock local_18;
  MutexLock l;
  FunctionMockerBase<int_(int)> *this_local;
  
  (this->super_UntypedFunctionMockerBase)._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_00207be0;
  l.mutex_ = (MutexBase *)this;
  GTestMutexLock::GTestMutexLock(&local_18,(MutexBase *)g_gmock_mutex);
  UntypedFunctionMockerBase::VerifyAndClearExpectationsLocked
            (&this->super_UntypedFunctionMockerBase);
  Mock::UnregisterLocked(&this->super_UntypedFunctionMockerBase);
  (*(this->super_UntypedFunctionMockerBase)._vptr_UntypedFunctionMockerBase[2])();
  GTestMutexLock::~GTestMutexLock(&local_18);
  MockSpec<int_(int)>::~MockSpec(&this->current_spec_);
  UntypedFunctionMockerBase::~UntypedFunctionMockerBase(&this->super_UntypedFunctionMockerBase);
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    MutexLock l(&g_gmock_mutex);
    VerifyAndClearExpectationsLocked();
    Mock::UnregisterLocked(this);
    ClearDefaultActionsLocked();
  }